

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::quantize(FastText *this,Args *qargs)

{
  real rVar1;
  double dVar2;
  string sVar3;
  int iVar4;
  element_type *peVar5;
  invalid_argument *this_00;
  ulong uVar6;
  ulong uVar7;
  size_type sVar8;
  real *prVar9;
  element_type *peVar10;
  string *in_RSI;
  long in_RDI;
  int j;
  int i;
  shared_ptr<fasttext::Matrix> ninput;
  vector<int,_std::allocator<int>_> idx;
  vector<long,_std::allocator<long>_> *in_stack_fffffffffffffe48;
  Model *in_stack_fffffffffffffe50;
  Model *this_01;
  Matrix *in_stack_fffffffffffffe58;
  undefined1 qout;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe60;
  vector<long,_std::allocator<long>_> *this_02;
  shared_ptr<fasttext::QMatrix> *qwi;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  byte bVar11;
  shared_ptr<fasttext::Args> *in_stack_fffffffffffffe78;
  shared_ptr<fasttext::Matrix> *in_stack_fffffffffffffe80;
  Matrix *in_stack_fffffffffffffe88;
  entry_type type;
  undefined4 in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  FastText *this_03;
  undefined1 local_e8 [12];
  int32_t in_stack_ffffffffffffff24;
  FastText *in_stack_ffffffffffffff28;
  undefined1 local_b8 [36];
  undefined4 local_94;
  shared_ptr<fasttext::QMatrix> local_90;
  undefined4 local_7c;
  int local_58;
  int local_54;
  size_type local_50;
  element_type *in_stack_ffffffffffffffc8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffd0;
  
  peVar5 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x16b1b4);
  if (peVar5->model != sup) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"For now we only support quantization of supervised models");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  peVar5 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x16b22e);
  std::__cxx11::string::operator=((string *)peVar5,in_RSI);
  sVar3 = in_RSI[0xd1];
  peVar5 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x16b260);
  peVar5->qout = (bool)((byte)sVar3 & 1);
  peVar5 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x16b294);
  std::__cxx11::string::operator=((string *)&peVar5->output,in_RSI + 0x20);
  if (*(long *)(in_RSI + 0xd8) != 0) {
    uVar7 = *(ulong *)(in_RSI + 0xd8);
    std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x16b2e6);
    uVar6 = Matrix::size(in_stack_fffffffffffffe58,(int64_t)in_stack_fffffffffffffe50);
    if (uVar7 < uVar6) {
      this_03 = (FastText *)&stack0xffffffffffffffc8;
      selectEmbeddings(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
      std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x16b342);
      Dictionary::prune((Dictionary *)in_stack_ffffffffffffffd0._M_pi,
                        (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffc8);
      local_50 = std::vector<int,_std::allocator<int>_>::size
                           ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffc8);
      std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x16b376);
      std::make_shared<fasttext::Matrix,unsigned_long,int&>
                ((unsigned_long *)in_stack_fffffffffffffe78,
                 (int *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
      local_54 = 0;
      while( true ) {
        uVar7 = (ulong)local_54;
        sVar8 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffc8);
        if (sVar8 <= uVar7) break;
        local_58 = 0;
        while( true ) {
          iVar4 = local_58;
          peVar5 = std::
                   __shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x16b3f6);
          if (peVar5->dim <= iVar4) break;
          std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x16b41a);
          std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffc8,(long)local_54);
          prVar9 = Matrix::at((Matrix *)in_stack_fffffffffffffe50,(int64_t)in_stack_fffffffffffffe48
                              ,0x16b449);
          rVar1 = *prVar9;
          std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x16b472);
          prVar9 = Matrix::at((Matrix *)in_stack_fffffffffffffe50,(int64_t)in_stack_fffffffffffffe48
                              ,0x16b48a);
          *prVar9 = rVar1;
          local_58 = local_58 + 1;
        }
        local_54 = local_54 + 1;
      }
      std::shared_ptr<fasttext::Matrix>::operator=
                (&in_stack_fffffffffffffe50->wi_,
                 (shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffe48);
      if (((byte)in_RSI[0xd2] & 1) != 0) {
        in_stack_fffffffffffffe9c = *(int *)(in_RSI + 0x54);
        peVar5 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x16b557);
        peVar5->epoch = in_stack_fffffffffffffe9c;
        dVar2 = *(double *)(in_RSI + 0x40);
        peVar5 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x16b581);
        peVar5->lr = dVar2;
        iVar4 = *(int *)(in_RSI + 0x7c);
        peVar5 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x16b5ab);
        peVar5->thread = iVar4;
        iVar4 = *(int *)(in_RSI + 0xa8);
        peVar5 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x16b5d4);
        peVar5->verbose = iVar4;
        startThreads(this_03);
      }
      std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x16b5fc);
      std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffe60);
    }
  }
  qout = (undefined1)((ulong)in_stack_fffffffffffffe58 >> 0x38);
  std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffffe50);
  std::make_shared<fasttext::QMatrix,fasttext::Matrix&,unsigned_long_const&,bool_const&>
            (in_stack_fffffffffffffe88,(unsigned_long *)in_stack_fffffffffffffe80,
             (bool *)in_stack_fffffffffffffe78);
  std::shared_ptr<fasttext::QMatrix>::operator=
            ((shared_ptr<fasttext::QMatrix> *)in_stack_fffffffffffffe50,
             (shared_ptr<fasttext::QMatrix> *)in_stack_fffffffffffffe48);
  std::shared_ptr<fasttext::QMatrix>::~shared_ptr((shared_ptr<fasttext::QMatrix> *)0x16b67d);
  peVar5 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x16b68a);
  if ((peVar5->qout & 1U) != 0) {
    std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffe50);
    local_7c = 2;
    std::make_shared<fasttext::QMatrix,fasttext::Matrix&,int,bool_const&>
              (in_stack_fffffffffffffe88,(int *)in_stack_fffffffffffffe80,
               (bool *)in_stack_fffffffffffffe78);
    std::shared_ptr<fasttext::QMatrix>::operator=
              ((shared_ptr<fasttext::QMatrix> *)in_stack_fffffffffffffe50,
               (shared_ptr<fasttext::QMatrix> *)in_stack_fffffffffffffe48);
    std::shared_ptr<fasttext::QMatrix>::~shared_ptr((shared_ptr<fasttext::QMatrix> *)0x16b6fc);
  }
  *(undefined1 *)(in_RDI + 0x88) = 1;
  local_94 = 0;
  qwi = &local_90;
  std::
  make_shared<fasttext::Model,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Args>&,int>
            ((shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
             in_stack_fffffffffffffe78,
             (int *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
  std::shared_ptr<fasttext::Model>::operator=
            ((shared_ptr<fasttext::Model> *)in_stack_fffffffffffffe50,
             (shared_ptr<fasttext::Model> *)in_stack_fffffffffffffe48);
  std::shared_ptr<fasttext::Model>::~shared_ptr((shared_ptr<fasttext::Model> *)0x16b763);
  bVar11 = *(byte *)(in_RDI + 0x88);
  peVar10 = std::__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x16b77f);
  peVar10->quant_ = (bool)(bVar11 & 1);
  std::__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16b796);
  std::shared_ptr<fasttext::QMatrix>::shared_ptr
            ((shared_ptr<fasttext::QMatrix> *)in_stack_fffffffffffffe50,
             (shared_ptr<fasttext::QMatrix> *)in_stack_fffffffffffffe48);
  type = (entry_type)((ulong)local_b8 >> 0x38);
  std::shared_ptr<fasttext::QMatrix>::shared_ptr
            ((shared_ptr<fasttext::QMatrix> *)in_stack_fffffffffffffe50,
             (shared_ptr<fasttext::QMatrix> *)in_stack_fffffffffffffe48);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16b7e4);
  Model::setQuantizePointer
            ((Model *)CONCAT17(bVar11,in_stack_fffffffffffffe70),qwi,
             (shared_ptr<fasttext::QMatrix> *)in_stack_fffffffffffffe60,(bool)qout);
  std::shared_ptr<fasttext::QMatrix>::~shared_ptr((shared_ptr<fasttext::QMatrix> *)0x16b811);
  std::shared_ptr<fasttext::QMatrix>::~shared_ptr((shared_ptr<fasttext::QMatrix> *)0x16b81e);
  peVar5 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x16b82b);
  if (peVar5->model == sup) {
    std::__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x16b846);
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x16b85c);
    this_02 = (vector<long,_std::allocator<long>_> *)&stack0xffffffffffffff30;
    Dictionary::getCounts
              ((Dictionary *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),type);
    Model::setTargetCounts(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    std::vector<long,_std::allocator<long>_>::~vector(this_02);
  }
  else {
    peVar10 = std::__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x16b903);
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x16b918);
    this_01 = (Model *)local_e8;
    Dictionary::getCounts
              ((Dictionary *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),type);
    Model::setTargetCounts(this_01,(vector<long,_std::allocator<long>_> *)peVar10);
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffe60);
  }
  return;
}

Assistant:

void FastText::quantize(const Args qargs) {
  if (args_->model != model_name::sup) {
    throw std::invalid_argument(
        "For now we only support quantization of supervised models");
  }
  args_->input = qargs.input;
  args_->qout = qargs.qout;
  args_->output = qargs.output;

  if (qargs.cutoff > 0 && qargs.cutoff < input_->size(0)) {
    auto idx = selectEmbeddings(qargs.cutoff);
    dict_->prune(idx);
    std::shared_ptr<Matrix> ninput =
        std::make_shared<Matrix>(idx.size(), args_->dim);
    for (auto i = 0; i < idx.size(); i++) {
      for (auto j = 0; j < args_->dim; j++) {
        ninput->at(i, j) = input_->at(idx[i], j);
      }
    }
    input_ = ninput;
    if (qargs.retrain) {
      args_->epoch = qargs.epoch;
      args_->lr = qargs.lr;
      args_->thread = qargs.thread;
      args_->verbose = qargs.verbose;
      startThreads();
    }
  }

  qinput_ = std::make_shared<QMatrix>(*input_, qargs.dsub, qargs.qnorm);

  if (args_->qout) {
    qoutput_ = std::make_shared<QMatrix>(*output_, 2, qargs.qnorm);
  }

  quant_ = true;
  model_ = std::make_shared<Model>(input_, output_, args_, 0);
  model_->quant_ = quant_;
  model_->setQuantizePointer(qinput_, qoutput_, args_->qout);
  if (args_->model == model_name::sup) {
    model_->setTargetCounts(dict_->getCounts(entry_type::label));
  } else {
    model_->setTargetCounts(dict_->getCounts(entry_type::word));
  }
}